

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

void __thiscall
chaiscript::ChaiScript_Basic::load_module
          (ChaiScript_Basic *this,string *t_module_name,string *t_filename)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
  *this_00;
  size_type sVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  Loadable_Module *this_01;
  __shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2> *this_02;
  Loadable_Module_Ptr lm;
  
  std::recursive_mutex::lock(&this->m_use_mutex);
  this_00 = &this->m_loaded_modules;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
          ::count(this_00,t_module_name);
  if (sVar1 == 0) {
    this_01 = (Loadable_Module *)operator_new(0x20);
    detail::Loadable_Module::Loadable_Module(this_01,t_module_name,t_filename);
    std::__shared_ptr<chaiscript::detail::Loadable_Module,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chaiscript::detail::Loadable_Module,void>
              ((__shared_ptr<chaiscript::detail::Loadable_Module,(__gnu_cxx::_Lock_policy)2> *)&lm,
               this_01);
    this_02 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
               ::operator[](this_00,t_module_name)->
               super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_02,&lm.
                        super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>
              );
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->m_active_loaded_modules,t_module_name);
    add(this,&(lm.
               super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_moduleptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lm.
                super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->m_active_loaded_modules,t_module_name);
    if (sVar2 == 0) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_active_loaded_modules,t_module_name);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
               ::operator[](this_00,t_module_name);
      add(this,&((pmVar3->
                 super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->m_moduleptr);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_use_mutex);
  return;
}

Assistant:

void load_module(const std::string &t_module_name, const std::string &t_filename) {
      chaiscript::detail::threading::lock_guard<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);

      if (m_loaded_modules.count(t_module_name) == 0) {
        detail::Loadable_Module_Ptr lm(new detail::Loadable_Module(t_module_name, t_filename));
        m_loaded_modules[t_module_name] = lm;
        m_active_loaded_modules.insert(t_module_name);
        add(lm->m_moduleptr);
      } else if (m_active_loaded_modules.count(t_module_name) == 0) {
        m_active_loaded_modules.insert(t_module_name);
        add(m_loaded_modules[t_module_name]->m_moduleptr);
      }
    }